

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genExtensionDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage)

{
  allocator<char> local_2d [16];
  allocator<char> local_1d;
  VkShaderStageFlagBits local_1c;
  void *pvStack_18;
  VkShaderStageFlagBits stage_local;
  ImageDescriptorCase *this_local;
  
  local_1c = stage;
  pvStack_18 = this;
  this_local = (ImageDescriptorCase *)__return_storage_ptr__;
  if (*(int *)((long)this + 0x8c) == 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#extension GL_OES_texture_cube_map_array : require\n",&local_1d);
    std::allocator<char>::~allocator(&local_1d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_2d)
    ;
    std::allocator<char>::~allocator(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genExtensionDeclarations (vk::VkShaderStageFlagBits stage) const
{
	DE_UNREF(stage);

	if (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)
		return "#extension GL_OES_texture_cube_map_array : require\n";
	else
		return "";
}